

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsTest.cpp
# Opt level: O1

void __thiscall
jaegertracing::metrics::MetricsTest_testCounter_Test::~MetricsTest_testCounter_Test
          (MetricsTest_testCounter_Test *this)

{
  *(undefined ***)&this->super_MetricsTest = &PTR__MetricsTest_0020f078;
  std::
  unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
  ::~unique_ptr(&(this->super_MetricsTest)._metrics);
  InMemoryStatsReporter::~InMemoryStatsReporter(&(this->super_MetricsTest)._metricsReporter);
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(MetricsTest, testCounter)
{
    constexpr auto counterValue = static_cast<int64_t>(3);
    constexpr auto metricName = "jaeger.test-counter";
    StatsFactoryImpl factory(_metricsReporter);
    auto counter = factory.createCounter(metricName);
    counter->inc(counterValue);
    const auto& counters = _metricsReporter.counters();
    ASSERT_EQ(1, counters.size());
    auto itr = counters.find(metricName);
    ASSERT_TRUE(itr != std::end(counters));
    ASSERT_EQ(counterValue, itr->second);
}